

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

bool __thiscall
basist::basisu_transcoder::get_userdata
          (basisu_transcoder *this,void *pData,uint32_t data_size,uint32_t *userdata0,
          uint32_t *userdata1)

{
  bool bVar1;
  
  bVar1 = validate_header_quick(this,pData,data_size);
  if (bVar1) {
    *userdata0 = *(uint32_t *)((long)pData + 0x1f);
    *userdata1 = *(uint32_t *)((long)pData + 0x23);
  }
  return bVar1;
}

Assistant:

bool basisu_transcoder::get_userdata(const void* pData, uint32_t data_size, uint32_t& userdata0, uint32_t& userdata1) const
	{
		if (!validate_header_quick(pData, data_size))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_userdata: header validation failed\n");
			return false;
		}

		const basis_file_header* pHeader = static_cast<const basis_file_header*>(pData);

		userdata0 = pHeader->m_userdata0;
		userdata1 = pHeader->m_userdata1;
		return true;
	}